

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayoutInfo::unnest(QDockAreaLayoutInfo *this,int index)

{
  QDockAreaLayoutInfo *pQVar1;
  ulong uVar2;
  pointer pQVar3;
  iterator iVar4;
  long i;
  
  i = (long)index;
  pQVar3 = QList<QDockAreaLayoutItem>::data(&this->item_list);
  pQVar1 = pQVar3[i].subinfo;
  if ((pQVar1 != (QDockAreaLayoutInfo *)0x0) && (uVar2 = (pQVar1->item_list).d.size, uVar2 < 2)) {
    if (uVar2 == 0) {
      QList<QDockAreaLayoutItem>::removeAt(&this->item_list,i);
      return;
    }
    pQVar3 = pQVar3 + i;
    iVar4 = QList<QDockAreaLayoutItem>::begin(&pQVar1->item_list);
    if ((iVar4.i)->widgetItem == (QLayoutItem *)0x0) {
      if ((iVar4.i)->subinfo != (QDockAreaLayoutInfo *)0x0) {
        pQVar1 = pQVar3->subinfo;
        pQVar3->subinfo = (iVar4.i)->subinfo;
        (iVar4.i)->subinfo = (QDockAreaLayoutInfo *)0x0;
        QList<QDockAreaLayoutItem>::clear(&pQVar1->item_list);
        if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
          ~QDockAreaLayoutInfo(pQVar1);
        }
        operator_delete(pQVar1,0x70);
        return;
      }
    }
    else {
      pQVar3->widgetItem = (iVar4.i)->widgetItem;
      pQVar1 = pQVar3->subinfo;
      if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
        ~QDockAreaLayoutInfo(pQVar1);
      }
      operator_delete(pQVar1,0x70);
      pQVar3->subinfo = (QDockAreaLayoutInfo *)0x0;
    }
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::unnest(int index)
{
    QDockAreaLayoutItem &item = item_list[index];
    if (item.subinfo == nullptr)
        return;
    if (item.subinfo->item_list.size() > 1)
        return;

    if (item.subinfo->item_list.size() == 0) {
        item_list.removeAt(index);
    } else if (item.subinfo->item_list.size() == 1) {
        QDockAreaLayoutItem &child = item.subinfo->item_list.first();
        if (child.widgetItem != nullptr) {
            item.widgetItem = child.widgetItem;
            delete item.subinfo;
            item.subinfo = nullptr;
        } else if (child.subinfo != nullptr) {
            QDockAreaLayoutInfo *tmp = item.subinfo;
            item.subinfo = child.subinfo;
            child.subinfo = nullptr;
            tmp->item_list.clear();
            delete tmp;
        }
    }
}